

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::ParseExpression(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ParseState copy;
  ParseState copy2;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar7 = false;
    goto LAB_00254443;
  }
  bVar6 = ParseTemplateParam(state);
  bVar7 = true;
  if (bVar6) goto LAB_00254443;
  bVar6 = ParseExprPrimary(state);
  if (bVar6) goto LAB_00254443;
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseTwoCharToken(state,"cl");
  if (bVar6) {
    bVar6 = OneOrMore(ParseExpression,state);
    if (bVar6) {
      bVar6 = ParseOneCharToken(state,'E');
      bVar7 = true;
      if (bVar6) goto LAB_00254443;
    }
  }
  pPVar1 = &state->parse_state;
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseThreeCharToken(state,"pp_");
  if (bVar6) {
LAB_00254359:
    bVar6 = ParseExpression(state);
    bVar7 = true;
    if (bVar6) goto LAB_00254443;
  }
  else {
    bVar6 = ParseThreeCharToken(state,"mm_");
    if (bVar6) goto LAB_00254359;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"cp");
  if (bVar6) {
    bVar6 = ParseSimpleId(state);
    if (bVar6) {
      do {
        bVar6 = ParseExpression(state);
      } while (bVar6);
      bVar6 = ParseOneCharToken(state,'E');
      bVar7 = true;
      if (bVar6) goto LAB_00254443;
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"so");
  if (bVar6) {
    bVar6 = ParseType(state);
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) {
        ParseNumber(state,(int *)0x0);
        while( true ) {
          bVar6 = ParseOneCharToken(state,'_');
          if (!bVar6) break;
          ParseNumber(state,(int *)0x0);
        }
        ParseOneCharToken(state,'p');
        bVar6 = ParseOneCharToken(state,'E');
        bVar7 = true;
        if (bVar6) goto LAB_00254443;
      }
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseFunctionParam(state);
  bVar7 = true;
  if (bVar6) goto LAB_00254443;
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"tl");
  if (bVar6) {
    bVar6 = ParseType(state);
    if (bVar6) {
      do {
        bVar6 = ParseBracedExpression(state);
      } while (bVar6);
      bVar6 = ParseOneCharToken(state,'E');
      if (bVar6) goto LAB_00254443;
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"il");
  if (bVar6) {
    do {
      bVar6 = ParseBracedExpression(state);
    } while (bVar6);
    bVar6 = ParseOneCharToken(state,'E');
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  ParseTwoCharToken(state,"gs");
  bVar6 = ParseTwoCharToken(state,"nw");
  if (bVar6) {
LAB_0025450e:
    do {
      bVar6 = ParseExpression(state);
    } while (bVar6);
    bVar6 = ParseOneCharToken(state,'_');
    if (bVar6) {
      bVar6 = ParseType(state);
      if (bVar6) {
        bVar6 = ParseOneCharToken(state,'E');
        if (bVar6) goto LAB_00254443;
        iVar8 = state->recursion_depth;
        iVar2 = state->steps;
        state->recursion_depth = iVar8 + 1;
        state->steps = iVar2 + 1;
        if (iVar2 < 0x20000 && iVar8 < 0x100) {
          copy2.mangled_idx = pPVar1->mangled_idx;
          copy2.out_cur_idx = pPVar1->out_cur_idx;
          copy2.prev_name_idx = (state->parse_state).prev_name_idx;
          copy2._12_4_ = *(undefined4 *)&(state->parse_state).field_0xc;
          bVar6 = ParseTwoCharToken(state,"pi");
          if (bVar6) {
            do {
              bVar6 = ParseExpression(state);
            } while (bVar6);
            bVar6 = ParseOneCharToken(state,'E');
            if (!bVar6) goto LAB_002545b2;
LAB_002545e9:
            state->recursion_depth = state->recursion_depth + -1;
            goto LAB_00254443;
          }
LAB_002545b2:
          pPVar1->mangled_idx = copy2.mangled_idx;
          pPVar1->out_cur_idx = copy2.out_cur_idx;
          (state->parse_state).prev_name_idx = copy2.prev_name_idx;
          *(undefined4 *)&(state->parse_state).field_0xc = copy2._12_4_;
          bVar6 = ParseTwoCharToken(state,"il");
          if (bVar6) {
            do {
              bVar6 = ParseBracedExpression(state);
            } while (bVar6);
            bVar6 = ParseOneCharToken(state,'E');
            if (bVar6) goto LAB_002545e9;
          }
          pPVar1->mangled_idx = copy2.mangled_idx;
          pPVar1->out_cur_idx = copy2.out_cur_idx;
          (state->parse_state).prev_name_idx = copy2.prev_name_idx;
          *(undefined4 *)&(state->parse_state).field_0xc = copy2._12_4_;
          iVar8 = state->recursion_depth + -1;
        }
        state->recursion_depth = iVar8;
      }
    }
  }
  else {
    bVar6 = ParseTwoCharToken(state,"na");
    if (bVar6) goto LAB_0025450e;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  ParseTwoCharToken(state,"gs");
  bVar6 = ParseTwoCharToken(state,"dl");
  if (bVar6) {
LAB_0025463f:
    bVar6 = ParseExpression(state);
    if (bVar6) goto LAB_00254443;
  }
  else {
    bVar6 = ParseTwoCharToken(state,"da");
    if (bVar6) goto LAB_0025463f;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseCharClass(state,"dscr");
  if (bVar6) {
    bVar6 = ParseOneCharToken(state,'c');
    if (bVar6) {
      bVar6 = ParseType(state);
      if (bVar6) {
        bVar6 = ParseExpression(state);
        if (bVar6) goto LAB_00254443;
      }
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"cv");
  if (bVar6) {
    bVar6 = ParseType(state);
    if (bVar6) {
      copy2.mangled_idx = pPVar1->mangled_idx;
      copy2.out_cur_idx = pPVar1->out_cur_idx;
      copy2.prev_name_idx = (state->parse_state).prev_name_idx;
      copy2._12_4_ = *(undefined4 *)&(state->parse_state).field_0xc;
      bVar6 = ParseOneCharToken(state,'_');
      if (bVar6) {
        do {
          bVar6 = ParseExpression(state);
        } while (bVar6);
        bVar6 = ParseOneCharToken(state,'E');
        if (bVar6) goto LAB_00254443;
      }
      pPVar1->mangled_idx = copy2.mangled_idx;
      pPVar1->out_cur_idx = copy2.out_cur_idx;
      (state->parse_state).prev_name_idx = copy2.prev_name_idx;
      *(undefined4 *)&(state->parse_state).field_0xc = copy2._12_4_;
      bVar6 = ParseExpression(state);
LAB_00254763:
      if (bVar6 != false) goto LAB_00254443;
    }
  }
  else {
    copy2.mangled_idx = -1;
    bVar6 = ParseOperatorName(state,&copy2.mangled_idx);
    if (bVar6 && 0 < copy2.mangled_idx) {
      if (2 < (uint)copy2.mangled_idx) {
        bVar6 = ParseExpression(state);
        if (!bVar6) goto LAB_0025476b;
      }
      iVar8 = copy2.mangled_idx;
      if (1 < copy2.mangled_idx) {
        bVar6 = ParseExpression(state);
        if (!bVar6) goto LAB_0025476b;
        iVar8 = copy2.mangled_idx;
      }
      if (iVar8 < 1) goto LAB_00254443;
      bVar6 = ParseExpression(state);
      goto LAB_00254763;
    }
  }
LAB_0025476b:
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"ti");
  if (bVar6) {
    bVar6 = ParseType(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"te");
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"st");
  if (bVar6) {
    bVar6 = ParseType(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"at");
  if (bVar6) {
    bVar6 = ParseType(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"az");
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"nx");
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"sZ");
  if (bVar6) {
    bVar6 = ParseFunctionParam(state);
    if (bVar6) goto LAB_00254443;
    bVar6 = ParseTemplateParam(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"sP");
  if (bVar6) {
    do {
      bVar6 = ParseTemplateArg(state);
    } while (bVar6);
    bVar6 = ParseOneCharToken(state,'E');
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"fl");
  if (bVar6) {
LAB_00254910:
    bVar6 = ParseOperatorName(state,(int *)0x0);
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) goto LAB_00254443;
    }
  }
  else {
    bVar6 = ParseTwoCharToken(state,"fr");
    if (bVar6) goto LAB_00254910;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"fL");
  if (bVar6) {
LAB_0025495c:
    bVar6 = ParseOperatorName(state,(int *)0x0);
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) {
        bVar6 = ParseExpression(state);
        if (bVar6) goto LAB_00254443;
      }
    }
  }
  else {
    bVar6 = ParseTwoCharToken(state,"fR");
    if (bVar6) goto LAB_0025495c;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"tw");
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"tr");
  if (bVar6) goto LAB_00254443;
  bVar6 = ParseTwoCharToken(state,"dt");
  if (bVar6) {
LAB_002549f6:
    bVar6 = ParseExpression(state);
    if (bVar6) {
      bVar6 = ParseUnresolvedName(state);
      if (bVar6) goto LAB_00254443;
    }
  }
  else {
    bVar6 = ParseTwoCharToken(state,"pt");
    if (bVar6) goto LAB_002549f6;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"ds");
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) goto LAB_00254443;
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"sp");
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (bVar6) goto LAB_00254443;
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseOneCharToken(state,'u');
  if (bVar6) {
    bVar6 = ParseSourceName(state);
    if (bVar6) {
      do {
        bVar6 = ParseTemplateArg(state);
      } while (bVar6);
      bVar6 = ParseOneCharToken(state,'E');
      if (bVar6) goto LAB_00254443;
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"rq");
  if (bVar6) {
    bVar6 = OneOrMore(ParseRequirement,state);
    if (bVar6) {
      bVar6 = ParseOneCharToken(state,'E');
      if (bVar6) goto LAB_00254443;
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseTwoCharToken(state,"rQ");
  if (bVar6) {
    bVar6 = ParseBareFunctionType(state);
    if (bVar6) {
      bVar6 = ParseOneCharToken(state,'_');
      if (bVar6) {
        bVar6 = OneOrMore(ParseRequirement,state);
        if (bVar6) {
          bVar6 = ParseOneCharToken(state,'E');
          if (bVar6) goto LAB_00254443;
        }
      }
    }
  }
  pPVar1->mangled_idx = uVar3;
  pPVar1->out_cur_idx = uVar4;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
  bVar7 = ParseUnresolvedName(state);
LAB_00254443:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar7;
}

Assistant:

static bool ParseExpression(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  ParseState copy = state->parse_state;

  // Object/function call expression.
  if (ParseTwoCharToken(state, "cl") && OneOrMore(ParseExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Preincrement and predecrement.  Postincrement and postdecrement are handled
  // by the operator-name logic later on.
  if ((ParseThreeCharToken(state, "pp_") ||
       ParseThreeCharToken(state, "mm_")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Clang-specific "cp <simple-id> <expression>* E"
  //   https://clang.llvm.org/doxygen/ItaniumMangle_8cpp_source.html#l04338
  if (ParseTwoCharToken(state, "cp") && ParseSimpleId(state) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= so <type> <expression> [<number>] <union-selector>* [p] E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/47
  if (ParseTwoCharToken(state, "so") && ParseType(state) &&
      ParseExpression(state) && Optional(ParseNumber(state, nullptr)) &&
      ZeroOrMore(ParseUnionSelector, state) &&
      Optional(ParseOneCharToken(state, 'p')) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= <function-param>
  if (ParseFunctionParam(state)) return true;
  state->parse_state = copy;

  // <expression> ::= tl <type> <braced-expression>* E
  if (ParseTwoCharToken(state, "tl") && ParseType(state) &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= il <braced-expression>* E
  if (ParseTwoCharToken(state, "il") &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] nw <expression>* _ <type> E
  //              ::= [gs] nw <expression>* _ <type> <initializer>
  //              ::= [gs] na <expression>* _ <type> E
  //              ::= [gs] na <expression>* _ <type> <initializer>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "nw") || ParseTwoCharToken(state, "na")) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, '_') &&
      ParseType(state) &&
      (ParseOneCharToken(state, 'E') || ParseInitializer(state))) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] dl <expression>
  //              ::= [gs] da <expression>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "dl") || ParseTwoCharToken(state, "da")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // dynamic_cast, static_cast, const_cast, reinterpret_cast.
  //
  // <expression> ::= (dc | sc | cc | rc) <type> <expression>
  if (ParseCharClass(state, "dscr") && ParseOneCharToken(state, 'c') &&
      ParseType(state) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parse the conversion expressions jointly to avoid re-parsing the <type> in
  // their common prefix.  Parsed as:
  // <expression> ::= cv <type> <conversion-args>
  // <conversion-args> ::= _ <expression>* E
  //                   ::= <expression>
  //
  // Also don't try ParseOperatorName after seeing "cv", since ParseOperatorName
  // also needs to accept "cv <type>" in other contexts.
  if (ParseTwoCharToken(state, "cv")) {
    if (ParseType(state)) {
      ParseState copy2 = state->parse_state;
      if (ParseOneCharToken(state, '_') && ZeroOrMore(ParseExpression, state) &&
          ParseOneCharToken(state, 'E')) {
        return true;
      }
      state->parse_state = copy2;
      if (ParseExpression(state)) {
        return true;
      }
    }
  } else {
    // Parse unary, binary, and ternary operator expressions jointly, taking
    // care not to re-parse subexpressions repeatedly. Parse like:
    //   <expression> ::= <operator-name> <expression>
    //                    [<one-to-two-expressions>]
    //   <one-to-two-expressions> ::= <expression> [<expression>]
    int arity = -1;
    if (ParseOperatorName(state, &arity) &&
        arity > 0 &&  // 0 arity => disabled.
        (arity < 3 || ParseExpression(state)) &&
        (arity < 2 || ParseExpression(state)) &&
        (arity < 1 || ParseExpression(state))) {
      return true;
    }
  }
  state->parse_state = copy;

  // typeid(type)
  if (ParseTwoCharToken(state, "ti") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // typeid(expression)
  if (ParseTwoCharToken(state, "te") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof type
  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(type)
  if (ParseTwoCharToken(state, "at") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(expression), a GNU extension
  if (ParseTwoCharToken(state, "az") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // noexcept(expression) appearing as an expression in a dependent signature
  if (ParseTwoCharToken(state, "nx") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack)
  //
  // <expression> ::= sZ <template-param>
  //              ::= sZ <function-param>
  if (ParseTwoCharToken(state, "sZ") &&
      (ParseFunctionParam(state) || ParseTemplateParam(state))) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack) captured from an alias template
  //
  // <expression> ::= sP <template-arg>* E
  if (ParseTwoCharToken(state, "sP") && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Unary folds (... op pack) and (pack op ...).
  //
  // <expression> ::= fl <binary operator-name> <expression>
  //              ::= fr <binary operator-name> <expression>
  if ((ParseTwoCharToken(state, "fl") || ParseTwoCharToken(state, "fr")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Binary folds (init op ... op pack) and (pack op ... op init).
  //
  // <expression> ::= fL <binary operator-name> <expression> <expression>
  //              ::= fR <binary operator-name> <expression> <expression>
  if ((ParseTwoCharToken(state, "fL") || ParseTwoCharToken(state, "fR")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tw <expression>: throw e
  if (ParseTwoCharToken(state, "tw") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tr: throw (rethrows an exception from the handler that caught it)
  if (ParseTwoCharToken(state, "tr")) return true;

  // Object and pointer member access expressions.
  //
  // <expression> ::= (dt | pt) <expression> <unresolved-name>
  if ((ParseTwoCharToken(state, "dt") || ParseTwoCharToken(state, "pt")) &&
      ParseExpression(state) && ParseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Pointer-to-member access expressions.  This parses the same as a binary
  // operator, but it's implemented separately because "ds" shouldn't be
  // accepted in other contexts that parse an operator name.
  if (ParseTwoCharToken(state, "ds") && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parameter pack expansion
  if (ParseTwoCharToken(state, "sp") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Vendor extended expressions
  if (ParseOneCharToken(state, 'u') && ParseSourceName(state) &&
      ZeroOrMore(ParseTemplateArg, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rq <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rq") && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rQ <bare-function-type> _ <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rQ") && ParseBareFunctionType(state) &&
      ParseOneCharToken(state, '_') && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return ParseUnresolvedName(state);
}